

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keywrap.c
# Opt level: O2

int keyUnwrapCryptoPro(gost_ctx *ctx,uchar *keyExchangeKey,uchar *wrappedKey,uchar *sessionKey)

{
  uchar cek_mac [4];
  uchar kek_ukm [32];
  
  keyDiversifyCryptoPro(ctx,keyExchangeKey,wrappedKey,kek_ukm);
  gost_key(ctx,kek_ukm);
  gost_dec(ctx,wrappedKey + 8,sessionKey,4);
  gost_mac_iv(ctx,0x20,wrappedKey,sessionKey,0x20,cek_mac);
  return (uint)(cek_mac == *(uchar (*) [4])(wrappedKey + 0x28));
}

Assistant:

int keyUnwrapCryptoPro(gost_ctx * ctx, const unsigned char *keyExchangeKey,
                       const unsigned char *wrappedKey,
                       unsigned char *sessionKey)
{
    unsigned char kek_ukm[32], cek_mac[4];
    keyDiversifyCryptoPro(ctx, keyExchangeKey, wrappedKey
                          /* First 8 bytes of wrapped Key is ukm */
                          , kek_ukm);
    gost_key(ctx, kek_ukm);
    gost_dec(ctx, wrappedKey + 8, sessionKey, 4);
    gost_mac_iv(ctx, 32, wrappedKey, sessionKey, 32, cek_mac);
    if (memcmp(cek_mac, wrappedKey + 40, 4)) {
        return 0;
    }
    return 1;
}